

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O3

void __thiscall
presolve::HPresolve::changeImplRowDualUpper
          (HPresolve *this,HighsInt row,double newUpper,HighsInt originCol)

{
  int oldImplVarUpperSource;
  int node;
  HighsInt col;
  bool bVar1;
  bool bVar2;
  long lVar3;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *this_00;
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *pvVar4;
  double dVar5;
  pair<std::_Rb_tree_iterator<int>,_std::_Rb_tree_iterator<int>_> pVar6;
  iterator __begin1;
  HighsInt local_94;
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *local_90;
  double local_88;
  HighsInt local_7c;
  iterator local_78;
  
  lVar3 = (long)row;
  local_88 = (this->implRowDualUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar3];
  oldImplVarUpperSource =
       (this->rowDualUpperSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start[lVar3];
  dVar5 = -(this->options->super_HighsOptionsStruct).dual_feasibility_tolerance;
  local_94 = row;
  local_90 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)newUpper;
  if ((dVar5 <= local_88) && (newUpper < dVar5)) {
    markChangedRow(this,row);
  }
  bVar1 = isDualImpliedFree(this,row);
  if (bVar1) {
    bVar1 = false;
  }
  else {
    dVar5 = (this->rowDualUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar3] +
            (this->options->super_HighsOptionsStruct).dual_feasibility_tolerance;
    if (local_88 <= dVar5) {
      bVar1 = false;
    }
    else {
      bVar1 = (double)local_90 <= dVar5;
    }
  }
  if (oldImplVarUpperSource != originCol) {
    if ((oldImplVarUpperSource != -1) &&
       (oldImplVarUpperSource !=
        (this->rowDualLowerSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar3])) {
      this_00 = &(this->implRowDualSourceByCol).
                 super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[oldImplVarUpperSource]._M_t;
      pVar6 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
              equal_range(this_00,&local_94);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
      _M_erase_aux(this_00,(_Base_ptr)pVar6.first._M_node,(_Base_ptr)pVar6.second._M_node);
    }
    if (originCol != -1) {
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_emplace_unique<int&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 ((this->implRowDualSourceByCol).
                  super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + originCol),&local_94);
    }
    (this->rowDualUpperSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start[local_94] = originCol;
    lVar3 = (long)local_94;
  }
  (this->implRowDualUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[lVar3] = (double)local_90;
  if (!bVar1) {
    pvVar4 = local_90;
    if (local_88 <= (double)local_90) {
      pvVar4 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)local_88;
    }
    if ((this->rowDualUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar3] <= (double)pvVar4) {
      return;
    }
  }
  node = (this->rowroot).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start[lVar3];
  if (node == -1) {
    local_78.stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_78.stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_78.nodeLeft = (HighsInt *)0x0;
    local_78.nodeRight = (HighsInt *)0x0;
    local_78.pos_.index_ = (HighsInt *)0x0;
    local_78.pos_.value_ = (double *)0x0;
    local_78.stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_78.currentNode = -1;
  }
  else {
    HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::iterator
              (&local_78,
               (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->ARleft).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,node);
  }
  local_90 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
             &this->substitutionOpportunities;
  while (local_78.currentNode != -1) {
    HighsLinearSumBounds::updatedImplVarUpper
              (&this->impliedDualRowBounds,*local_78.pos_.index_,local_94,*local_78.pos_.value_,
               local_88,oldImplVarUpperSource);
    markChangedCol(this,*local_78.pos_.index_);
    if (bVar1) {
      col = *local_78.pos_.index_;
      bVar2 = isImpliedFree(this,col);
      if (bVar2) {
        local_7c = col;
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int&,int>
                  (local_90,&local_94,&local_7c);
      }
    }
    HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::operator++(&local_78);
  }
  if (local_78.stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void HPresolve::changeImplRowDualUpper(HighsInt row, double newUpper,
                                       HighsInt originCol) {
  double oldImplUpper = implRowDualUpper[row];
  HighsInt oldUpperSource = rowDualUpperSource[row];

  if (oldImplUpper >= -options->dual_feasibility_tolerance &&
      newUpper < -options->dual_feasibility_tolerance)
    markChangedRow(row);

  bool newDualImplied =
      !isDualImpliedFree(row) &&
      oldImplUpper > rowDualUpper[row] + options->dual_feasibility_tolerance &&
      newUpper <= rowDualUpper[row] + options->dual_feasibility_tolerance;

  // remember the source of this upper bound, so that we can correctly identify
  // weak domination
  if (oldUpperSource != originCol) {
    if (oldUpperSource != -1 && oldUpperSource != rowDualLowerSource[row])
      implRowDualSourceByCol[oldUpperSource].erase(row);
    if (originCol != -1) implRowDualSourceByCol[originCol].emplace(row);

    rowDualUpperSource[row] = originCol;
  }

  // update implied bound
  implRowDualUpper[row] = newUpper;

  // nothing needs to be updated
  if (!newDualImplied && std::min(oldImplUpper, newUpper) >= rowDualUpper[row])
    return;

  for (const HighsSliceNonzero& nonzero : getRowVector(row)) {
    impliedDualRowBounds.updatedImplVarUpper(
        nonzero.index(), row, nonzero.value(), oldImplUpper, oldUpperSource);
    markChangedCol(nonzero.index());

    if (newDualImplied && isImpliedFree(nonzero.index()))
      substitutionOpportunities.emplace_back(row, nonzero.index());
  }
}